

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

BrandArgumentList * __thiscall
capnp::Schema::getBrandArgumentsAtScope
          (BrandArgumentList *__return_storage_ptr__,Schema *this,uint64_t scopeId)

{
  RawBrandedSchema *pRVar1;
  Scope *pSVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  Binding *pBVar6;
  long lVar7;
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_78;
  WirePointer *local_68;
  int local_60;
  StructReader local_50;
  
  local_68 = (WirePointer *)this->raw->generic->encodedNode;
  local_78 = (ArrayPtr<const_char>)ZEXT816(0);
  local_60 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_50,(PointerReader *)&local_78,(word *)0x0);
  if (local_50.dataSize < 0x121) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = (bool)(*(byte *)((long)local_50.data + 0x24) & 1);
    if (_kjCondition.value != false) {
      pRVar1 = this->raw;
      uVar5 = (ulong)pRVar1->scopeCount;
      if (uVar5 != 0) {
        pSVar2 = pRVar1->scopes;
        lVar7 = 0;
        do {
          if (*(uint64_t *)((long)&pSVar2->typeId + lVar7) == scopeId) {
            if ((&pSVar2->isUnbound)[lVar7] != false) {
              bVar3 = true;
              goto LAB_0019efbb;
            }
            uVar4 = *(uint *)((long)&pSVar2->bindingCount + lVar7);
            pBVar6 = *(Binding **)((long)&pSVar2->bindings + lVar7);
            bVar3 = false;
            goto LAB_0019efbf;
          }
          lVar7 = lVar7 + 0x18;
        } while (uVar5 * 0x18 != lVar7);
      }
      bVar3 = &pRVar1->generic->defaultBrand != pRVar1 && uVar5 == 0;
LAB_0019efbb:
      uVar4 = 0;
      pBVar6 = (Binding *)0x0;
LAB_0019efbf:
      __return_storage_ptr__->scopeId = scopeId;
      __return_storage_ptr__->size_ = uVar4;
      __return_storage_ptr__->isUnbound = bVar3;
      __return_storage_ptr__->bindings = pBVar6;
      return __return_storage_ptr__;
    }
  }
  local_68 = (WirePointer *)this->raw->generic->encodedNode;
  local_78 = (ArrayPtr<const_char>)ZEXT816(0);
  local_60 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_50,(PointerReader *)&local_78,(word *)0x0);
  local_78 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&local_50);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[20],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0xfb,FAILED,"getProto().getIsGeneric()",
             "_kjCondition,\"Not a generic type.\", getProto().getDisplayName()",&_kjCondition,
             (char (*) [20])"Not a generic type.",(Reader *)&local_78);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Schema::BrandArgumentList Schema::getBrandArgumentsAtScope(uint64_t scopeId) const {
  KJ_REQUIRE(getProto().getIsGeneric(), "Not a generic type.", getProto().getDisplayName());

  for (auto scope: kj::range(raw->scopes, raw->scopes + raw->scopeCount)) {
    if (scope->typeId == scopeId) {
      // OK, this scope matches the scope we're looking for.
      if (scope->isUnbound) {
        return BrandArgumentList(scopeId, true);
      } else {
        return BrandArgumentList(scopeId, scope->bindingCount, scope->bindings);
      }
    }
  }

  // This scope is not listed in the scopes list.
  return BrandArgumentList(scopeId, raw->isUnbound());
}